

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

void __thiscall cmServerResponse::SetData(cmServerResponse *this,Value *data)

{
  bool bVar1;
  Value *pVVar2;
  string local_60;
  Value local_40;
  
  if (this->m_Payload != PAYLOAD_UNKNOWN) {
    __assert_fail("this->m_Payload == PAYLOAD_UNKNOWN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerProtocol.cxx"
                  ,0x57,"void cmServerResponse::SetData(const Json::Value &)");
  }
  pVVar2 = Json::Value::operator[](data,&kCOOKIE_KEY_abi_cxx11_);
  bVar1 = Json::Value::isNull(pVVar2);
  if (bVar1) {
    pVVar2 = Json::Value::operator[](data,&kTYPE_KEY_abi_cxx11_);
    bVar1 = Json::Value::isNull(pVVar2);
    if (bVar1) {
      this->m_Payload = PAYLOAD_DATA;
      Json::Value::Value(&local_40,data);
      Json::Value::operator=(&this->m_Data,&local_40);
      Json::Value::~Value(&local_40);
      return;
    }
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Response contains cookie or type field.","");
  SetError(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmServerResponse::SetData(const Json::Value& data)
{
  assert(this->m_Payload == PAYLOAD_UNKNOWN);
  if (!data[kCOOKIE_KEY].isNull() || !data[kTYPE_KEY].isNull()) {
    this->SetError("Response contains cookie or type field.");
    return;
  }
  this->m_Payload = PAYLOAD_DATA;
  this->m_Data = data;
}